

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall
wasm::DataFlow::UseFinder::addSetUses
          (UseFinder *this,LocalSet *set,Graph *graph,LocalGraph *localGraph,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret)

{
  bool bVar1;
  int iVar2;
  SetInfluences *this_00;
  ostream *poVar3;
  size_type sVar4;
  reference ppLVar5;
  size_type sVar6;
  reference ppLVar7;
  pair<std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>,_bool> pVar8;
  Expression *local_a8;
  Expression *value;
  LocalSet *local_98;
  LocalSet *subSet;
  Expression *local_88;
  Expression *parent;
  GetInfluences *sets;
  LocalGet *get;
  const_iterator __end2;
  const_iterator __begin2;
  SetInfluences *__range2;
  SetInfluences *gets;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret_local;
  LocalGraph *localGraph_local;
  Graph *graph_local;
  LocalSet *set_local;
  UseFinder *this_local;
  
  graph_local = (Graph *)set;
  set_local = (LocalSet *)this;
  pVar8 = std::
          unordered_set<wasm::LocalSet*,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
          ::emplace<wasm::LocalSet*&>
                    ((unordered_set<wasm::LocalSet*,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                      *)this,(LocalSet **)&graph_local);
  if (((pVar8.second ^ 0xffU) & 1) == 0) {
    this_00 = LocalGraph::getSetInfluences(localGraph,(LocalSet *)graph_local);
    iVar2 = debug();
    if (1 < iVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"addSetUses for ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,graph_local);
      poVar3 = std::operator<<(poVar3,", ");
      sVar4 = std::
              unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              ::size(this_00);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
      std::operator<<(poVar3," gets\n");
    }
    __end2 = std::
             unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
             ::begin(this_00);
    get = (LocalGet *)
          std::
          unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
          ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<wasm::LocalGet_*,_false>,
                              (_Node_iterator_base<wasm::LocalGet_*,_false> *)&get), bVar1) {
      ppLVar5 = std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator*
                          (&__end2);
      sets = (GetInfluences *)*ppLVar5;
      parent = (Expression *)LocalGraph::getGetInfluences(localGraph,(LocalGet *)sets);
      sVar6 = std::
              unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              ::size((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                      *)parent);
      if (1 < sVar6) {
        __assert_fail("sets.size() <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                      ,0x67,
                      "void wasm::DataFlow::UseFinder::addSetUses(LocalSet *, Graph &, LocalGraph &, std::vector<Expression *> &)"
                     );
      }
      sVar6 = std::
              unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              ::size((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                      *)parent);
      if (sVar6 == 0) {
        local_88 = Graph::getParent(graph,(Expression *)sets);
        if ((local_88 == (Expression *)0x0) ||
           (bVar1 = Expression::is<wasm::Drop>(local_88), !bVar1)) {
          subSet = (LocalSet *)0x0;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (ret,(value_type *)&subSet);
          iVar2 = debug();
          if (1 < iVar2) {
            std::operator<<((ostream *)&std::cout,"add nullptr\n");
          }
        }
      }
      else {
        value = (Expression *)
                std::
                unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                ::begin((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                         *)parent);
        ppLVar7 = std::__detail::_Node_const_iterator<wasm::LocalSet_*,_true,_false>::operator*
                            ((_Node_const_iterator<wasm::LocalSet_*,_true,_false> *)&value);
        local_98 = *ppLVar7;
        if (local_98->value == (Expression *)sets) {
          addSetUses(this,local_98,graph,localGraph,ret);
        }
        else {
          local_a8 = local_98->value;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (ret,&local_a8);
          iVar2 = debug();
          if (1 < iVar2) {
            poVar3 = std::operator<<((ostream *)&std::cout,"add a value\n");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a8);
            std::operator<<(poVar3,'\n');
          }
        }
      }
      std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void addSetUses(LocalSet* set,
                  Graph& graph,
                  LocalGraph& localGraph,
                  std::vector<Expression*>& ret) {
    // If already handled, nothing to do here.
    if (!seenSets.emplace(set).second) {
      return;
    }
    // Find all the uses of that set.
    auto& gets = localGraph.getSetInfluences(set);
    if (debug() >= 2) {
      std::cout << "addSetUses for " << set << ", " << gets.size() << " gets\n";
    }
    for (auto* get : gets) {
      // Each of these relevant gets is either
      //  (1) a child of a set, which we can track, or
      //  (2) not a child of a set, e.g., a call argument or such
      auto& sets = localGraph.getGetInfluences(get); // TODO: iterator
      // In flat IR, each get can influence at most 1 set.
      assert(sets.size() <= 1);
      if (sets.size() == 0) {
        // This get is not the child of a set. Check if it is a drop,
        // otherwise it is an actual use, and so an external use.
        auto* parent = graph.getParent(get);
        if (parent && parent->is<Drop>()) {
          // Just ignore it.
        } else {
          ret.push_back(nullptr);
          if (debug() >= 2) {
            std::cout << "add nullptr\n";
          }
        }
      } else {
        // This get is the child of a set.
        auto* subSet = *sets.begin();
        // If this is a copy, we need to look through it: data-flow IR
        // counts actual values, not copies, and in particular we need
        // to look through the copies that implement a phi.
        if (subSet->value == get) {
          // Indeed a copy.
          // TODO: this could be optimized and done all at once beforehand.
          addSetUses(subSet, graph, localGraph, ret);
        } else {
          // Not a copy.
          auto* value = subSet->value;
          ret.push_back(value);
          if (debug() >= 2) {
            std::cout << "add a value\n" << value << '\n';
          }
        }
      }
    }
  }